

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::NewRandomAccessFile
          (InMemoryEnv *this,string *fname,RandomAccessFile **result)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  *this_00;
  FileState *this_01;
  int iVar1;
  iterator iVar2;
  undefined8 *puVar3;
  mapped_type *ppFVar4;
  undefined8 *in_RCX;
  Slice local_50;
  Slice local_40;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&fname->field_2);
  if (iVar1 == 0) {
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
               *)((long)&fname[1].field_2 + 8);
    iVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
            ::find(this_00,(key_type *)result);
    if (iVar2._M_node == (_Base_ptr)(fname + 2)) {
      *in_RCX = 0;
      local_40.data_ = (char *)*result;
      local_40.size_ = (size_t)result[1];
      local_50.data_ = "File not found";
      local_50.size_ = 0xe;
      Status::Status((Status *)this,kIOError,&local_40,&local_50);
    }
    else {
      puVar3 = (undefined8 *)operator_new(0x10);
      ppFVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
                ::operator[](this_00,(key_type *)result);
      this_01 = *ppFVar4;
      *puVar3 = &PTR__RandomAccessFileImpl_00180068;
      puVar3[1] = this_01;
      FileState::Ref(this_01);
      *in_RCX = puVar3;
      (this->super_EnvWrapper).super_Env._vptr_Env = (_func_int **)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&fname->field_2);
    return (Status)(char *)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

Status NewRandomAccessFile(const std::string& fname,
                             RandomAccessFile** result) override {
    MutexLock lock(&mutex_);
    if (file_map_.find(fname) == file_map_.end()) {
      *result = nullptr;
      return Status::IOError(fname, "File not found");
    }

    *result = new RandomAccessFileImpl(file_map_[fname]);
    return Status::OK();
  }